

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execLea<(moira::Instr)67,(moira::Mode)2,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  *(undefined4 *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x38) =
       *(undefined4 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  return;
}

Assistant:

void
Moira::execLea(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    reg.a[dst] = computeEA<M,S>(src);
    if (isIdxMode(M)) sync(2);

    prefetch<POLLIPL>();
}